

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<unsigned_long>::assign
          (SmallVectorImpl<unsigned_long> *this,size_type NumElts,unsigned_long *Elt)

{
  void *pvVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  uVar5 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_long,_true>).
                 super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity
  ;
  if (uVar5 < NumElts) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,NumElts,8);
    uVar5 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_long,_true>).
                   super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.
                   Capacity;
  }
  if (NumElts <= uVar5) {
    (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
    super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = (uint)NumElts;
    auVar4 = _DAT_001954a0;
    auVar3 = _DAT_00195490;
    if (NumElts != 0) {
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
               super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
      uVar2 = *Elt;
      uVar5 = NumElts + 0x1fffffffffffffff & 0x1fffffffffffffff;
      auVar7._8_4_ = (int)uVar5;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = (int)(uVar5 >> 0x20);
      lVar6 = 0;
      auVar7 = auVar7 ^ _DAT_001954a0;
      do {
        auVar8._8_4_ = (int)lVar6;
        auVar8._0_8_ = lVar6;
        auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar8 = (auVar8 | auVar3) ^ auVar4;
        if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                    auVar7._4_4_ < auVar8._4_4_) & 1)) {
          *(unsigned_long *)((long)pvVar1 + lVar6 * 8) = uVar2;
        }
        if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
            auVar8._12_4_ <= auVar7._12_4_) {
          *(unsigned_long *)((long)pvVar1 + lVar6 * 8 + 8) = uVar2;
        }
        lVar6 = lVar6 + 2;
      } while ((uVar5 - ((uint)(NumElts + 0x1fffffffffffffff) & 1)) + 2 != lVar6);
    }
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void assign(size_type NumElts, const T &Elt) {
    clear();
    if (this->capacity() < NumElts)
      this->grow(NumElts);
    this->set_size(NumElts);
    std::uninitialized_fill(this->begin(), this->end(), Elt);
  }